

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

Frag __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Frag>::WalkInternal
          (Walker<duckdb_re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  ushort uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined4 uVar8;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar11;
  undefined4 extraout_var_00;
  uint32_t extraout_var_01;
  uint32_t extraout_var_02;
  _Elt_pointer pWVar12;
  Frag *pFVar13;
  uint uVar14;
  undefined8 uVar15;
  Frag *pFVar16;
  uint32_t uVar17;
  undefined8 uVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  Regexp *pRVar19;
  ulong uVar20;
  Frag FVar21;
  undefined4 uVar22;
  uint32_t uStack_1c4;
  undefined4 uVar23;
  undefined4 uStack_1bc;
  bool stop;
  int local_1a8;
  Frag local_1a4;
  uint32_t local_194;
  PatchList local_190;
  bool local_188;
  uint32_t local_184;
  PatchList local_180;
  bool local_178;
  Frag *local_170;
  
  uVar15 = top_arg._8_8_;
  uVar18 = top_arg._0_8_;
  Reset(this);
  if (re == (Regexp *)0x0) {
    _stop = (Regexp *)((ulong)_stop & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"Walk NULL");
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00ea3594:
    FVar21.end.tail = (uint32_t)uVar15;
    FVar21.nullable = SUB81(uVar15,4);
    FVar21._13_3_ = SUB83(uVar15,5);
    FVar21.begin = (uint32_t)uVar18;
    FVar21.end.head = SUB84(uVar18,4);
    return FVar21;
  }
  _stop = re;
  local_1a4._0_8_ = uVar18;
  local_1a4._8_8_ = uVar15;
  do {
    local_170 = (Frag *)0x0;
    local_178 = false;
    local_180.head = 0;
    local_180.tail = 0;
    local_184 = 0;
    local_188 = false;
    local_190.head = 0;
    local_190.tail = 0;
    local_194 = 0;
    local_1a8 = -1;
    std::
    deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
    ::emplace_back<duckdb_re2::WalkState<duckdb_re2::Frag>>
              ((deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
                *)&this->stack_,(WalkState<duckdb_re2::Frag> *)&stop);
LAB_00ea32d9:
    uVar22 = 0;
    uVar23 = 0;
    pWVar12 = (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar12 ==
        (this->stack_).c.
        super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pWVar12 = (this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
    }
    pRVar19 = pWVar12[-1].re;
    uVar20 = (ulong)(uint)pWVar12[-1].n;
    if (pWVar12[-1].n == 0xffffffff) {
      iVar9 = this->max_visits_;
      this->max_visits_ = iVar9 + -1;
      if (iVar9 < 1) {
        this->stopped_early_ = true;
        uVar7._0_4_ = pWVar12[-1].parent_arg.begin;
        uVar7._4_4_ = pWVar12[-1].parent_arg.end.head;
        uVar2 = (*this->_vptr_Walker[5])
                          (this,pRVar19,uVar7,*(undefined8 *)&pWVar12[-1].parent_arg.end.tail);
        uVar17 = (uint32_t)extraout_RDX_02;
        uStack_1bc = CONCAT31(uStack_1bc._1_3_,(char)((ulong)extraout_RDX_02 >> 0x20));
        uStack_1c4 = extraout_var_02;
      }
      else {
        _stop = (Regexp *)((ulong)_stop & 0xffffffffffffff00);
        uVar3._0_4_ = pWVar12[-1].parent_arg.begin;
        uVar3._4_4_ = pWVar12[-1].parent_arg.end.head;
        iVar9 = (*this->_vptr_Walker[2])
                          (this,pRVar19,uVar3,*(undefined8 *)&pWVar12[-1].parent_arg.end.tail,
                           (WalkState<duckdb_re2::Frag> *)&stop);
        pWVar12[-1].pre_arg.begin = iVar9;
        pWVar12[-1].pre_arg.end.head = extraout_var;
        pWVar12[-1].pre_arg.end.tail = (uint32_t)extraout_RDX;
        pWVar12[-1].pre_arg.nullable = SUB81((ulong)extraout_RDX >> 0x20,0);
        if (stop == false) {
          pWVar12[-1].n = 0;
          pWVar12[-1].child_args = (Frag *)0x0;
          uVar1 = pRVar19->nsub_;
          uVar20 = (ulong)uVar1;
          if (uVar1 != 0) {
            if (uVar1 == 1) {
              pWVar12[-1].child_args = &pWVar12[-1].child_arg;
              uVar20 = 0;
            }
            else {
              pFVar13 = (Frag *)operator_new__((ulong)uVar1 * 0x10);
              pFVar16 = pFVar13;
              do {
                pFVar16->begin = 0;
                (pFVar16->end).head = 0;
                (pFVar16->end).tail = 0;
                pFVar16->nullable = false;
                pFVar16 = pFVar16 + 1;
              } while (pFVar16 != pFVar13 + uVar1);
              pWVar12[-1].child_args = pFVar13;
              uVar20 = (ulong)(uint)pWVar12[-1].n;
            }
          }
          goto LAB_00ea3309;
        }
        uVar2 = pWVar12[-1].pre_arg.begin;
        uVar8 = pWVar12[-1].pre_arg.end.head;
        uVar18 = *(undefined8 *)((long)&pWVar12[-1].pre_arg.end.head + 1);
        uVar17 = (uint32_t)((ulong)uVar18 >> 0x18);
        uStack_1bc._0_1_ = (undefined1)((ulong)uVar18 >> 0x38);
        uStack_1c4 = uVar8;
      }
      goto LAB_00ea345f;
    }
LAB_00ea3309:
    uVar1 = pRVar19->nsub_;
    if (uVar1 == 0) {
LAB_00ea33ea:
      uVar5._0_4_ = pWVar12[-1].parent_arg.begin;
      uVar5._4_4_ = pWVar12[-1].parent_arg.end.head;
      uVar6._0_4_ = pWVar12[-1].pre_arg.begin;
      uVar6._4_4_ = pWVar12[-1].pre_arg.end.head;
      uVar2 = (*this->_vptr_Walker[3])
                        (this,pRVar19,uVar5,*(undefined8 *)&pWVar12[-1].parent_arg.end.tail,uVar6,
                         *(undefined8 *)&pWVar12[-1].pre_arg.end.tail,pWVar12[-1].child_args,uVar20,
                         uVar22,uVar23);
      uVar17 = (uint32_t)extraout_RDX_01;
      uStack_1bc = CONCAT31(uStack_1bc._1_3_,(char)((ulong)extraout_RDX_01 >> 0x20));
      uStack_1c4 = extraout_var_01;
      if ((1 < pRVar19->nsub_) && (pWVar12[-1].child_args != (Frag *)0x0)) {
        operator_delete__(pWVar12[-1].child_args);
      }
LAB_00ea345f:
      std::
      deque<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
      ::pop_back(&(this->stack_).c);
      pWVar12 = (this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar12 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        uVar18._4_4_ = uStack_1c4;
        uVar18._0_4_ = uVar2;
        uVar15._4_4_ = uStack_1bc;
        uVar15._0_4_ = uVar17;
        goto LAB_00ea3594;
      }
      if (pWVar12 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar12 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
      }
      if (pWVar12[-1].child_args == (Frag *)0x0) {
        pFVar16 = &pWVar12[-1].child_arg;
      }
      else {
        pFVar16 = pWVar12[-1].child_args + pWVar12[-1].n;
      }
      *(ulong *)((long)&(pFVar16->end).head + 1) =
           CONCAT17((undefined1)uStack_1bc,CONCAT43(uVar17,uStack_1c4._1_3_));
      pFVar16->begin = uVar2;
      (pFVar16->end).head = uStack_1c4;
      pWVar12[-1].n = pWVar12[-1].n + 1;
      goto LAB_00ea32d9;
    }
    if (uVar1 == 1) {
      paVar11 = &pRVar19->field_5;
    }
    else {
      paVar11 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar19->field_5).submany_;
    }
    iVar9 = (int)uVar20;
    if ((int)(uint)uVar1 <= iVar9) goto LAB_00ea33ea;
    if (use_copy && 0 < iVar9) {
      uVar14 = iVar9 - 1;
      pRVar19 = (Regexp *)paVar11[uVar20].submany_;
      if ((Regexp *)paVar11[uVar14].submany_ != pRVar19) goto LAB_00ea3523;
      pFVar16 = pWVar12[-1].child_args + uVar14;
      uVar4._0_4_ = pFVar16->begin;
      uVar4._4_4_ = (pFVar16->end).head;
      iVar10 = (*this->_vptr_Walker[4])
                         (this,uVar4,*(undefined8 *)&pWVar12[-1].child_args[uVar14].end.tail);
      pFVar16 = pWVar12[-1].child_args;
      iVar9 = pWVar12[-1].n;
      pFVar16[iVar9].begin = iVar10;
      pFVar16[iVar9].end.head = extraout_var_00;
      pFVar16[iVar9].end.tail = (uint32_t)extraout_RDX_00;
      pFVar16[iVar9].nullable = SUB81((ulong)extraout_RDX_00 >> 0x20,0);
      pWVar12[-1].n = pWVar12[-1].n + 1;
      goto LAB_00ea32d9;
    }
    pRVar19 = (Regexp *)paVar11[iVar9].submany_;
LAB_00ea3523:
    local_1a4.begin = pWVar12[-1].pre_arg.begin;
    local_1a4.end.head = pWVar12[-1].pre_arg.end.head;
    local_1a4._8_8_ = *(undefined8 *)&pWVar12[-1].pre_arg.end.tail;
    _stop = pRVar19;
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}